

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestMembraneImpl::makeThing
          (TestMembraneImpl *this,MakeThingContext context)

{
  CapTableBuilder *pCVar1;
  ClientHook *pCVar2;
  undefined8 *puVar3;
  long *in_RDX;
  Own<capnp::ClientHook,_std::nullptr_t> OVar4;
  PointerBuilder local_88;
  SegmentBuilder *local_70;
  Own<capnp::ClientHook,_std::nullptr_t> OStack_68;
  StructBuilder local_58;
  undefined1 local_30;
  
  local_30 = 0;
  (**(code **)(*in_RDX + 0x10))(&local_70);
  local_88.pointer = (WirePointer *)OStack_68.ptr;
  local_88.segment = local_70;
  local_88.capTable = (CapTableBuilder *)OStack_68.disposer;
  PointerBuilder::getStruct(&local_58,&local_88,(StructSize)0x10000,(word *)0x0);
  puVar3 = (undefined8 *)operator_new(0x28);
  local_88.capTable = (CapTableBuilder *)(puVar3 + 3);
  puVar3[4] = 0;
  *puVar3 = 0x6b7750;
  puVar3[3] = 0x6b7790;
  puVar3[1] = "inside";
  puVar3[2] = 7;
  local_88.segment =
       (SegmentBuilder *)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::ThingImpl>::instance;
  OVar4 = Capability::Client::makeLocalClient
                    ((Client *)&OStack_68,
                     (Own<capnp::Capability::Server,_std::nullptr_t> *)&local_88);
  pCVar1 = local_88.capTable;
  if (local_88.capTable != (CapTableBuilder *)0x0) {
    local_88.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_88.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_88.segment,
               (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader,OVar4.ptr);
  }
  local_70 = (SegmentBuilder *)&capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  local_88.segment = local_58.segment;
  local_88.capTable = local_58.capTable;
  local_88.pointer = local_58.pointers;
  PointerBuilder::setCapability(&local_88,&OStack_68);
  pCVar2 = OStack_68.ptr;
  if (OStack_68.ptr != (ClientHook *)0x0) {
    OStack_68.ptr = (ClientHook *)0x0;
    (**((CapTableReader *)&(OStack_68.disposer)->_vptr_Disposer)->_vptr_CapTableReader)
              (OStack_68.disposer,
               (long)&((WireValue<uint32_t>_conflict *)&pCVar2->_vptr_ClientHook)->value +
               *(long *)(*(long *)&pCVar2->_vptr_ClientHook + -0x10));
  }
  kj::_::readyNow();
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> makeThing(MakeThingContext context) override {
    context.getResults().setThing(kj::heap<ThingImpl>("inside"));
    return kj::READY_NOW;
  }